

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,2>
          (MatrixCaseUtils *this,Vector<float,_2> *a,Vector<float,_2> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Vector<float,_2> extraout_XMM0_Qa;
  Matrix<float,_2,_2> MVar5;
  int local_38;
  int local_34;
  int c;
  int r;
  Matrix<float,_2,_2> retVal;
  Vector<float,_2> *b_local;
  Vector<float,_2> *a_local;
  Vector<float,_2> VVar4;
  
  retVal.m_data.m_data[1].m_data = (float  [2])b;
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)&c);
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      pfVar3 = tcu::Vector<float,_2>::operator[](a,local_38);
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_2>::operator[]
                         ((Vector<float,_2> *)retVal.m_data.m_data[1].m_data,local_34);
      fVar2 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)&c,local_34,local_38);
      *pfVar3 = fVar1 * fVar2;
    }
  }
  MVar5 = tcu::transpose<float,2,2>((tcu *)this,(Matrix<float,_2,_2> *)&c);
  VVar4.m_data = MVar5.m_data.m_data[1].m_data;
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)&c);
  MVar5.m_data.m_data[1].m_data[0] = VVar4.m_data[0];
  MVar5.m_data.m_data[1].m_data[1] = VVar4.m_data[1];
  MVar5.m_data.m_data[0].m_data[0] = extraout_XMM0_Qa.m_data[0];
  MVar5.m_data.m_data[0].m_data[1] = extraout_XMM0_Qa.m_data[1];
  return (Matrix<float,_2,_2>)MVar5.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}